

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Generic_Lift(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  bool bVar1;
  int iVar2;
  EPlatType type;
  int iVar3;
  
  type = platUpByValue;
  if (arg3 - 1U < 4) {
    type = *(EPlatType *)(&DAT_00602acc + (ulong)(arg3 - 1U) * 4);
  }
  iVar3 = arg2 * 0x23;
  iVar2 = iVar3 + 7;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  bVar1 = EV_DoPlat(arg0,(line_t_conflict *)ln,type,(double)(arg4 << 3),(double)arg1 * 0.125,
                    iVar2 >> 3,0,0);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Generic_Lift)
// Generic_Lift (tag, speed, delay, target, height)
{
	DPlat::EPlatType type;

	switch (arg3)
	{
		case 1:
			type = DPlat::platDownWaitUpStay;
			break;
		case 2:
			type = DPlat::platDownToNearestFloor;
			break;
		case 3:
			type = DPlat::platDownToLowestCeiling;
			break;
		case 4:
			type = DPlat::platPerpetualRaise;
			break;
		default:
			type = DPlat::platUpByValue;
			break;
	}

	return EV_DoPlat (arg0, ln, type, arg4*8, SPEED(arg1), OCTICS(arg2), 0, 0);
}